

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O0

void __thiscall henson::NameMap::add(NameMap *this,string *name,Value *value)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
  *in_RDX;
  queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_RDI;
  key_type *in_stack_00000008;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_00000010;
  iterator it;
  _Self local_28;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
       ::find(in_RDX,(key_type *)0x18cd8f);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
       ::end(in_RDX);
  bVar1 = std::operator!=(local_20,&local_28);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  *)in_RDI);
    std::
    queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push(in_RDI,(value_type *)in_RDX);
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[](in_stack_00000010,in_stack_00000008);
    mpark::
    variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=((variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_RDI,
                (variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_RDX);
  }
  return;
}

Assistant:

void        add(const std::string& name, Value value)
        {
            auto it = queues_.find(name);
            if (it != queues_.end())
                it->second.push(value);
            else
                values_[name] = value;
        }